

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

Var create_module(Context *ctx,Module *module,bool validate)

{
  _func_int **pp_Var1;
  CreateBufferFn p_Var2;
  Result RVar3;
  uint uVar4;
  Var pvVar5;
  undefined8 *puVar6;
  undefined1 auStack_58 [8];
  MemoryStream stream;
  WriteBinaryOptions s_write_binary_options;
  
  if (module == (Module *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "No module found";
    __cxa_throw(puVar6,&ChakraWabt::WabtAPIError::typeinfo,0);
  }
  if (validate) {
    join_0x00000010_0x00000000_ = GetWabtFeatures(ctx->chakra);
    auStack_58 = (undefined1  [8])0x0;
    stream.super_Stream._vptr_Stream = (_func_int **)0x0;
    stream.super_Stream.offset_ = 0;
    RVar3 = wabt::ValidateModule(module,(Errors *)auStack_58,(ValidateOptions *)&stream.buf_);
    CheckResult(RVar3,(Errors *)auStack_58,ctx->lexer,"Failed to validate module");
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)auStack_58);
  }
  wabt::MemoryStream::MemoryStream((MemoryStream *)auStack_58,(Stream *)0x0);
  stack0xffffffffffffffd0 = (Features)CONCAT63(stack0xffffffffffffffd3,1);
  RVar3 = wabt::WriteBinaryModule((Stream *)auStack_58,module,(WriteBinaryOptions *)&stream.buf_);
  if (RVar3.enum_ == Ok) {
    pp_Var1 = (stream.super_Stream.log_stream_)->_vptr_Stream;
    p_Var2 = ctx->chakra->createBuffer;
    uVar4 = TruncSizeT((stream.super_Stream.log_stream_)->offset_ - (long)pp_Var1);
    pvVar5 = (*p_Var2)((uchar *)pp_Var1,uVar4,ctx->chakra->user_data);
    wabt::MemoryStream::~MemoryStream((MemoryStream *)auStack_58);
    return pvVar5;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Error while writing module";
  __cxa_throw(puVar6,&ChakraWabt::WabtAPIError::typeinfo,0);
}

Assistant:

Js::Var create_module(Context* ctx, const Module* module, bool validate = true)
{
    if (!module)
    {
        throw WabtAPIError("No module found");
    }
    if (validate)
    {
        ValidateOptions options(GetWabtFeatures(*ctx->chakra));
        Errors errors;
        Result result = ValidateModule(module, &errors, options);
        CheckResult(result, &errors, ctx->lexer, "Failed to validate module");
    }
    MemoryStream stream;
    WriteBinaryOptions s_write_binary_options;
    Result result = WriteBinaryModule(&stream, module, s_write_binary_options);
    if (!Succeeded(result))
    {
        throw WabtAPIError("Error while writing module");
    }
    const uint8_t* data = stream.output_buffer().data.data();
    const size_t size = stream.output_buffer().size();
    return ctx->chakra->createBuffer(data, TruncSizeT(size), ctx->chakra->user_data);
}